

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O3

bool __thiscall cmCTestBZR::LoadModifications(cmCTestBZR *this)

{
  char *bzr_status [4];
  OutputLogger err;
  StatusParser out;
  pointer local_188;
  char *local_180;
  char *local_178;
  undefined8 local_170;
  OutputLogger local_160;
  StatusParser local_120;
  
  local_188 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  local_180 = "status";
  local_178 = "-SV";
  local_170 = 0;
  StatusParser::StatusParser(&local_120,this,"status-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&local_160,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"status-err> ");
  cmCTestVC::RunChild((cmCTestVC *)this,&local_188,(OutputParser *)&local_120,
                      (OutputParser *)&local_160,(char *)0x0,Auto);
  local_160.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_007830e8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.super_LineParser.Line._M_dataplus._M_p !=
      &local_160.super_LineParser.Line.field_2) {
    operator_delete(local_160.super_LineParser.Line._M_dataplus._M_p,
                    local_160.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  local_120.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__StatusParser_007816a0;
  if (local_120.RegexStatus.program != (char *)0x0) {
    operator_delete__(local_120.RegexStatus.program);
  }
  local_120.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_007830e8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.super_LineParser.Line._M_dataplus._M_p !=
      &local_120.super_LineParser.Line.field_2) {
    operator_delete(local_120.super_LineParser.Line._M_dataplus._M_p,
                    local_120.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool cmCTestBZR::LoadModifications()
{
  // Run "bzr status" which reports local modifications.
  const char* bzr = this->CommandLineTool.c_str();
  const char* bzr_status[] = { bzr, "status", "-SV", CM_NULLPTR };
  StatusParser out(this, "status-out> ");
  OutputLogger err(this->Log, "status-err> ");
  this->RunChild(bzr_status, &out, &err);
  return true;
}